

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_printf_internal(JSContext *ctx,int argc,JSValue *argv,FILE *fp)

{
  byte bVar1;
  int64_t iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  JSRuntime *opaque;
  byte *pbVar6;
  uint8_t *p_00;
  char *ptr;
  size_t sVar7;
  byte bVar8;
  size_t len;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  JSValue JVar14;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val1;
  JSValue val1_00;
  JSValue val_03;
  int32_t int32_arg;
  char fmtbuf [32];
  int64_t int64_arg;
  DynBuf dbuf;
  double double_arg;
  size_t fmt_len;
  uint8_t *p;
  uint8_t cbuf [7];
  int local_e4;
  uint local_e0;
  int local_dc;
  FILE *local_d8;
  JSValue *local_d0;
  byte local_c8 [40];
  uint local_a0;
  undefined4 uStack_9c;
  DynBuf local_98;
  ulong local_68;
  byte *local_60;
  byte *local_58;
  double local_50;
  size_t local_48;
  byte *local_40;
  uint8_t local_37 [7];
  
  opaque = JS_GetRuntime(ctx);
  dbuf_init2(&local_98,opaque,js_realloc_rt);
  if (0 < argc) {
    pbVar6 = (byte *)JS_ToCStringLen2(ctx,&local_48,*argv,0);
    JVar14 = (JSValue)(ZEXT816(6) << 0x40);
    if (pbVar6 == (byte *)0x0) goto LAB_001104de;
    pbVar11 = pbVar6;
    local_dc = argc;
    local_d0 = argv;
    if (0 < (long)local_48) {
      pbVar10 = pbVar6 + local_48;
      local_e4 = 1;
LAB_0010ff4c:
      len = 0;
      while (local_40 = pbVar6, pbVar6[len] != 0x25) {
        lVar3 = len + 1;
        len = len + 1;
        if (pbVar10 <= pbVar6 + lVar3) {
          dbuf_put(&local_98,pbVar6,len);
          goto LAB_00110480;
        }
      }
      local_d8 = (FILE *)fp;
      local_58 = pbVar11;
      dbuf_put(&local_98,pbVar6,len);
      local_c8[0] = pbVar6[len];
      uVar13 = 0;
      while( true ) {
        bVar8 = pbVar6[uVar13 + len + 1];
        uVar9 = (ulong)bVar8;
        if (0x30 < uVar9) break;
        if ((0x1288900000000U >> (uVar9 & 0x3f) & 1) == 0) {
          if (uVar9 == 0x2a) {
            if (local_dc <= local_e4) goto LAB_0011050d;
            val.tag = local_d0[local_e4].tag;
            val.u.ptr = local_d0[local_e4].u.ptr;
            iVar4 = JS_ToInt32(ctx,(int32_t *)&local_e0,val);
            if (iVar4 != 0) goto LAB_00110523;
            local_e4 = local_e4 + 1;
            iVar4 = snprintf((char *)(local_c8 + uVar13 + 1),0x1f - uVar13,"%d",(ulong)local_e0);
            uVar12 = (long)iVar4 + uVar13 + 1;
            pbVar6 = pbVar6 + uVar13 + len + 2;
            bVar8 = *pbVar6;
            goto LAB_00110085;
          }
          break;
        }
        if (uVar13 == 0x1e) goto switchD_001101ae_caseD_62;
        local_c8[uVar13 + 1] = bVar8;
        uVar13 = uVar13 + 1;
      }
      pbVar11 = pbVar6 + uVar13 + len;
      while( true ) {
        pbVar6 = pbVar11 + 1;
        uVar12 = uVar13 + 1;
        if (bVar8 - 0x3a < 0xfffffff6) break;
        if (0x1e < uVar12) goto switchD_001101ae_caseD_62;
        local_c8[uVar13 + 1] = (byte)uVar9;
        bVar8 = pbVar11[2];
        uVar9 = (ulong)bVar8;
        uVar13 = uVar12;
        pbVar11 = pbVar6;
      }
LAB_00110085:
      if (bVar8 == 0x2e) {
        if (0x1e < (long)uVar12) goto switchD_001101ae_caseD_62;
        local_c8[uVar12] = 0x2e;
        bVar8 = pbVar6[1];
        uVar5 = (uint)bVar8;
        uVar13 = uVar12 + 1;
        pbVar11 = pbVar6;
        if (uVar5 != 0x2a) {
          while (uVar12 = uVar13, pbVar6 = pbVar11 + 1, 0xfffffff5 < uVar5 - 0x3a) {
            if (uVar12 == 0x1f) goto switchD_001101ae_caseD_62;
            local_c8[uVar12] = bVar8;
            bVar8 = pbVar11[2];
            uVar13 = uVar12 + 1;
            pbVar11 = pbVar6;
            uVar5 = (uint)bVar8;
          }
          goto LAB_00110154;
        }
        if (local_dc <= local_e4) goto LAB_0011050d;
        val_00.tag = local_d0[local_e4].tag;
        val_00.u.ptr = local_d0[local_e4].u.ptr;
        iVar4 = JS_ToInt32(ctx,(int32_t *)&local_e0,val_00);
        if (iVar4 == 0) {
          local_e4 = local_e4 + 1;
          iVar4 = snprintf((char *)(local_c8 + uVar12 + 1),0x1f - uVar12,"%d",(ulong)local_e0);
          uVar12 = uVar12 + 1 + (long)iVar4;
          bVar8 = pbVar6[2];
          pbVar6 = pbVar6 + 2;
          goto LAB_00110154;
        }
LAB_00110523:
        JVar14 = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_001104de;
      }
LAB_00110154:
      if (0x1e < (long)uVar12) goto switchD_001101ae_caseD_62;
      uVar13 = (ulong)(bVar8 == 0x6c);
      bVar1 = pbVar6[uVar13];
      local_c8[uVar12] = bVar1;
      local_c8[uVar12 + 1] = 0;
      local_68 = uVar13;
      local_60 = pbVar6;
      if (bVar1 < 0x58) {
        if (bVar1 - 0x45 < 3) {
switchD_001101ae_caseD_61:
          if (local_e4 < local_dc) {
            val_02.tag = local_d0[local_e4].tag;
            val_02.u.ptr = local_d0[local_e4].u.ptr;
            iVar4 = JS_ToFloat64(ctx,&local_50,val_02);
            if (iVar4 != 0) goto LAB_00110523;
            dbuf_printf(&local_98,(char *)local_c8,local_50);
            goto LAB_001103d3;
          }
LAB_0011050d:
          JS_ThrowReferenceError(ctx,"missing argument for conversion specifier");
          goto LAB_001104d9;
        }
        if (bVar1 != 0x25) {
          if (bVar1 != 0x41) goto switchD_001101ae_caseD_62;
          goto switchD_001101ae_caseD_61;
        }
        dbuf_putc(&local_98,'%');
        fp = (FILE *)local_d8;
        goto LAB_001103d8;
      }
      switch(bVar1) {
      case 0x61:
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_001101ae_caseD_61;
      case 99:
        if (local_dc <= local_e4) goto LAB_0011050d;
        iVar2 = local_d0[local_e4].tag;
        if ((int)iVar2 == -7) {
          val1.tag = iVar2;
          val1.u.ptr = local_d0[local_e4].u.ptr;
          p_00 = (uint8_t *)JS_ToCStringLen2(ctx,(size_t *)0x0,val1,0);
          if (p_00 != (uint8_t *)0x0) {
            local_e0 = unicode_from_utf8(p_00,6,&local_40);
            JS_FreeCString(ctx,(char *)p_00);
LAB_00110424:
            fp = (FILE *)local_d8;
            if (0x10ffff < local_e0) {
              local_e0 = 0xfffd;
            }
            local_e4 = local_e4 + 1;
            iVar4 = unicode_to_utf8(local_37,local_e0);
            dbuf_put(&local_98,local_37,(long)iVar4);
            goto LAB_001103d8;
          }
        }
        else {
          val_03.tag = iVar2;
          val_03.u.ptr = local_d0[local_e4].u.ptr;
          iVar4 = JS_ToInt32(ctx,(int32_t *)&local_e0,val_03);
          if (iVar4 == 0) goto LAB_00110424;
        }
        goto LAB_001104d9;
      case 100:
      case 0x69:
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_001101ae_caseD_64:
        if (local_dc <= local_e4) goto LAB_0011050d;
        val_01.tag = local_d0[local_e4].tag;
        val_01.u.ptr = local_d0[local_e4].u.ptr;
        iVar4 = JS_ToInt64Ext(ctx,(int64_t *)&local_a0,val_01);
        if (iVar4 != 0) goto LAB_001104d9;
        if (bVar8 == 0x6c) {
          if (0x1c < (long)uVar12) goto switchD_001101ae_caseD_62;
          local_c8[uVar12 + 2] = local_c8[uVar12];
          (local_c8 + uVar12)[0] = 0x6c;
          (local_c8 + uVar12)[1] = 0x6c;
          local_c8[uVar12 + 3] = 0;
          dbuf_printf(&local_98,(char *)local_c8,CONCAT44(uStack_9c,local_a0));
        }
        else {
          dbuf_printf(&local_98,(char *)local_c8,(ulong)local_a0);
        }
        goto LAB_001103d3;
      case 0x73:
        goto switchD_001101ae_caseD_73;
      default:
        if (bVar1 == 0x58) goto switchD_001101ae_caseD_64;
      case 0x62:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x76:
      case 0x77:
switchD_001101ae_caseD_62:
        JS_ThrowTypeError(ctx,"invalid conversion specifier in format string");
LAB_001104d9:
        JVar14 = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_001104de;
      }
    }
LAB_00110480:
    JS_FreeCString(ctx,(char *)pbVar11);
  }
  if (local_98.error == 0) {
    if ((FILE *)fp == (FILE *)0x0) {
      JVar14 = JS_NewStringLen(ctx,(char *)local_98.buf,local_98.size);
    }
    else {
      sVar7 = fwrite(local_98.buf,1,local_98.size,(FILE *)fp);
      JVar14.tag = 0;
      JVar14.u.ptr = (void *)(sVar7 & 0xffffffff);
    }
  }
  else {
    JVar14 = JS_ThrowOutOfMemory(ctx);
  }
LAB_001104de:
  dbuf_free(&local_98);
  return JVar14;
switchD_001101ae_caseD_73:
  if (local_dc <= local_e4) goto LAB_0011050d;
  val1_00.tag = local_d0[local_e4].tag;
  val1_00.u.ptr = local_d0[local_e4].u.ptr;
  ptr = JS_ToCStringLen2(ctx,(size_t *)0x0,val1_00,0);
  if (ptr == (char *)0x0) goto LAB_00110523;
  dbuf_printf(&local_98,(char *)local_c8,ptr);
  JS_FreeCString(ctx,ptr);
LAB_001103d3:
  local_e4 = local_e4 + 1;
  fp = (FILE *)local_d8;
LAB_001103d8:
  pbVar6 = local_60 + local_68 + 1;
  pbVar11 = local_58;
  if (pbVar10 <= pbVar6) goto LAB_00110480;
  goto LAB_0010ff4c;
}

Assistant:

static JSValue js_printf_internal(JSContext *ctx,
                                  int argc, JSValueConst *argv, FILE *fp)
{
    char fmtbuf[32];
    uint8_t cbuf[UTF8_CHAR_LEN_MAX+1];
    JSValue res;
    DynBuf dbuf;
    const char *fmt_str;
    const uint8_t *fmt, *fmt_end;
    const uint8_t *p;
    char *q;
    int i, c, len, mod;
    size_t fmt_len;
    int32_t int32_arg;
    int64_t int64_arg;
    double double_arg;
    const char *string_arg;
    /* Use indirect call to dbuf_printf to prevent gcc warning */
    int (*dbuf_printf_fun)(DynBuf *s, const char *fmt, ...) = (void*)dbuf_printf;

    js_std_dbuf_init(ctx, &dbuf);

    if (argc > 0) {
        fmt_str = JS_ToCStringLen(ctx, &fmt_len, argv[0]);
        if (!fmt_str)
            goto fail;

        i = 1;
        fmt = (const uint8_t *)fmt_str;
        fmt_end = fmt + fmt_len;
        while (fmt < fmt_end) {
            for (p = fmt; fmt < fmt_end && *fmt != '%'; fmt++)
                continue;
            dbuf_put(&dbuf, p, fmt - p);
            if (fmt >= fmt_end)
                break;
            q = fmtbuf;
            *q++ = *fmt++;  /* copy '%' */
            
            /* flags */
            for(;;) {
                c = *fmt;
                if (c == '0' || c == '#' || c == '+' || c == '-' || c == ' ' ||
                    c == '\'') {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = c;
                    fmt++;
                } else {
                    break;
                }
            }
            /* width */
            if (*fmt == '*') {
                if (i >= argc)
                    goto missing;
                if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                    goto fail;
                q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                fmt++;
            } else {
                while (my_isdigit(*fmt)) {
                    if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                        goto invalid;
                    *q++ = *fmt++;
                }
            }
            if (*fmt == '.') {
                if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                    goto invalid;
                *q++ = *fmt++;
                if (*fmt == '*') {
                    if (i >= argc)
                        goto missing;
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                    q += snprintf(q, fmtbuf + sizeof(fmtbuf) - q, "%d", int32_arg);
                    fmt++;
                } else {
                    while (my_isdigit(*fmt)) {
                        if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                            goto invalid;
                        *q++ = *fmt++;
                    }
                }
            }

            /* we only support the "l" modifier for 64 bit numbers */
            mod = ' ';
            if (*fmt == 'l') {
                mod = *fmt++;
            }
            
            /* type */
            c = *fmt++;
            if (q >= fmtbuf + sizeof(fmtbuf) - 1)
                goto invalid;
            *q++ = c;
            *q = '\0';
            
            switch (c) {
            case 'c':
                if (i >= argc)
                    goto missing;
                if (JS_IsString(argv[i])) {
                    string_arg = JS_ToCString(ctx, argv[i++]);
                    if (!string_arg)
                        goto fail;
                    int32_arg = unicode_from_utf8((uint8_t *)string_arg, UTF8_CHAR_LEN_MAX, &p);
                    JS_FreeCString(ctx, string_arg);
                } else {
                    if (JS_ToInt32(ctx, &int32_arg, argv[i++]))
                        goto fail;
                }
                /* handle utf-8 encoding explicitly */
                if ((unsigned)int32_arg > 0x10FFFF)
                    int32_arg = 0xFFFD;
                /* ignore conversion flags, width and precision */
                len = unicode_to_utf8(cbuf, int32_arg);
                dbuf_put(&dbuf, cbuf, len);
                break;
                
            case 'd':
            case 'i':
            case 'o':
            case 'u':
            case 'x':
            case 'X':
                if (i >= argc)
                    goto missing;
                if (JS_ToInt64Ext(ctx, &int64_arg, argv[i++]))
                    goto fail;
                if (mod == 'l') {
                    /* 64 bit number */
#if defined(_WIN32)
                    if (q >= fmtbuf + sizeof(fmtbuf) - 3)
                        goto invalid;
                    q[2] = q[-1];
                    q[-1] = 'I';
                    q[0] = '6';
                    q[1] = '4';
                    q[3] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (int64_t)int64_arg);
#else
                    if (q >= fmtbuf + sizeof(fmtbuf) - 2)
                        goto invalid;
                    q[1] = q[-1];
                    q[-1] = q[0] = 'l';
                    q[2] = '\0';
                    dbuf_printf_fun(&dbuf, fmtbuf, (long long)int64_arg);
#endif
                } else {
                    dbuf_printf_fun(&dbuf, fmtbuf, (int)int64_arg);
                }
                break;

            case 's':
                if (i >= argc)
                    goto missing;
                /* XXX: handle strings containing null characters */
                string_arg = JS_ToCString(ctx, argv[i++]);
                if (!string_arg)
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, string_arg);
                JS_FreeCString(ctx, string_arg);
                break;
                
            case 'e':
            case 'f':
            case 'g':
            case 'a':
            case 'E':
            case 'F':
            case 'G':
            case 'A':
                if (i >= argc)
                    goto missing;
                if (JS_ToFloat64(ctx, &double_arg, argv[i++]))
                    goto fail;
                dbuf_printf_fun(&dbuf, fmtbuf, double_arg);
                break;
                
            case '%':
                dbuf_putc(&dbuf, '%');
                break;
                
            default:
                /* XXX: should support an extension mechanism */
            invalid:
                JS_ThrowTypeError(ctx, "invalid conversion specifier in format string");
                goto fail;
            missing:
                JS_ThrowReferenceError(ctx, "missing argument for conversion specifier");
                goto fail;
            }
        }
        JS_FreeCString(ctx, fmt_str);
    }
    if (dbuf.error) {
        res = JS_ThrowOutOfMemory(ctx);
    } else {
        if (fp) {
            len = fwrite(dbuf.buf, 1, dbuf.size, fp);
            res = JS_NewInt32(ctx, len);
        } else {
            res = JS_NewStringLen(ctx, (char *)dbuf.buf, dbuf.size);
        }
    }
    dbuf_free(&dbuf);
    return res;

fail:
    dbuf_free(&dbuf);
    return JS_EXCEPTION;
}